

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_event_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload,uint32_t *rid)

{
  string_view str;
  string_view str_00;
  uint32_t uVar1;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar2;
  char *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  MiniBusClient *this_00;
  basic_string_view<char,_std::char_traits<char>_> data;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar3;
  uint *in_stack_00000008;
  const_buffer local_b8;
  undefined1 auStack_a8 [8];
  string_view view;
  undefined1 local_78 [8];
  MiniBusEncoder encoder;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lock;
  MiniBusClient *this_local;
  string_view payload_local;
  string_view command_local;
  shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tok;
  
  this_00 = (MiniBusClient *)command._M_len;
  lock._8_8_ = this_00;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_48,&this_00->mtx);
  uVar1 = select_rid(this_00);
  *in_stack_00000008 = uVar1;
  MiniBusEncoder::MiniBusEncoder((MiniBusEncoder *)local_78);
  MiniBusEncoder::insert_rid((MiniBusEncoder *)local_78,*in_stack_00000008);
  str_00._M_str = (char *)payload._M_len;
  str_00._M_len = (size_t)command._M_str;
  MiniBusEncoder::insert_short_string((MiniBusEncoder *)local_78,str_00);
  str._M_str = (char *)rid;
  str._M_len = (size_t)payload._M_str;
  view._M_str = payload._M_str;
  MiniBusEncoder::insert_long_string((MiniBusEncoder *)local_78,str);
  _auStack_a8 = MiniBusEncoder::view((MiniBusEncoder *)local_78);
  pbVar2 = std::
           optional<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           ::operator*(&this_00->socket);
  data._M_str = extraout_RDX;
  data._M_len = view._M_len;
  local_b8 = (const_buffer)boost::asio::buffer<char,std::char_traits<char>>((asio *)auStack_a8,data)
  ;
  boost::asio::transfer_all();
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_all_t>
            (pbVar2,&local_b8,0);
  std::make_shared<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>();
  std::
  map<unsigned_long,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  emplace<unsigned_int&,std::shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::string>>>&>
            ((map<unsigned_long,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)&this_00->reqmap,in_stack_00000008,
             (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this);
  MiniBusEncoder::~MiniBusEncoder((MiniBusEncoder *)local_78);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  sVar3.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX_00._M_pi;
  sVar3.
  super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar3.
           super___shared_ptr<mini_bus::SyncNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<SyncNotifyToken<std::optional<std::string>>>
  send_event(std::string_view command, std::string_view payload, uint32_t &rid) {
    std::unique_lock lock{mtx};
    rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<SyncNotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }